

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O0

UINT8 okim6295_r(void *chip,UINT8 offset)

{
  byte local_25;
  int local_24;
  UINT8 result;
  int voicenum;
  okim6295_state *info;
  UINT8 offset_local;
  void *chip_local;
  
  local_25 = 0xf0;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    if (*(char *)((long)chip + (long)local_24 * 0x30 + 0x20) != '\0') {
      local_25 = local_25 | (byte)(1 << ((byte)local_24 & 0x1f));
    }
  }
  return local_25;
}

Assistant:

static UINT8 okim6295_r(void* chip, UINT8 offset)
{
	okim6295_state *info = (okim6295_state *)chip;
	int voicenum;
	UINT8 result;

	result = 0xf0;  // naname expects bits 4-7 to be 1

	// set the bit to 1 if something is playing on a given channel
	for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++)
		if (info->voice[voicenum].playing)
			result |= 1 << voicenum;

	return result;
}